

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLABecLaplacian.cpp
# Opt level: O2

void __thiscall amrex::MLABecLaplacian::applyRobinBCTermsCoeffs(MLABecLaplacian *this)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  undefined8 uVar8;
  Box *this_00;
  bool bVar9;
  bool bVar10;
  uint uVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  long lVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  int *piVar20;
  long lVar21;
  long lVar22;
  long lVar23;
  int j;
  long lVar24;
  long lVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  long lVar29;
  long lVar30;
  long lVar31;
  long lVar32;
  long lVar33;
  long lVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  ulong uVar39;
  long lVar40;
  long lVar41;
  ulong uVar42;
  long lVar43;
  long lVar44;
  ulong uVar45;
  long lVar46;
  undefined4 uVar47;
  undefined4 uVar48;
  IntVect IVar49;
  long local_390;
  long local_370;
  long local_350;
  long local_348;
  long local_338;
  IntVect hi;
  Array4<const_double> local_2d0;
  Array4<double> local_290;
  long local_250;
  IntVect low;
  int local_23c;
  int iStack_238;
  IntVect hi_1;
  Box local_1a8;
  Box *local_188;
  MLABecLaplacian *local_180;
  Box local_178;
  MFItInfo local_15c;
  undefined1 local_148 [16];
  double local_138;
  double dStack_130;
  double local_128;
  double dStack_120;
  double local_118;
  double local_110;
  double local_108;
  double local_100;
  double local_f8;
  long local_f0;
  long local_e8;
  ulong local_e0;
  LinOpBCType *local_d8;
  LinOpBCType *local_d0;
  Vector<int,_std::allocator<int>_> *local_c8;
  pointer local_c0;
  ulong local_b8;
  long local_b0;
  long local_a8;
  int local_a0 [3];
  MFIter mfi;
  
  bVar9 = MLLinOp::hasRobinBC((MLLinOp *)this);
  if (bVar9) {
    uVar11 = (*(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp._vptr_MLLinOp[5])(this);
    local_110 = this->m_a_scalar;
    uVar47 = SUB84(local_110,0);
    uVar48 = (undefined4)((ulong)local_110 >> 0x20);
    if ((local_110 == 0.0) && (!NAN(local_110))) {
      this->m_a_scalar = 1.0;
      uVar47 = 0;
      uVar48 = 0x3ff00000;
    }
    local_118 = this->m_b_scalar / (double)CONCAT44(uVar48,uVar47);
    uVar42 = 0;
    local_180 = this;
    local_b8 = (ulong)uVar11;
    if ((int)uVar11 < 1) {
      local_b8 = uVar42;
    }
    while ((long)uVar42 <
           (long)(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_num_amr_levels) {
      local_188 = *(Box **)&(this->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_geom.
                            super_vector<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                            .
                            super__Vector_base<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>,_std::allocator<amrex::Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar42].
                            super_vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>.
                            super__Vector_base<amrex::Geometry,_std::allocator<amrex::Geometry>_>;
      local_128 = *(double *)((long)local_188 + 0x38);
      dStack_120 = 0.0;
      local_138 = *(double *)((long)local_188 + 0x40);
      dStack_130 = 0.0;
      local_148._8_8_ = 0;
      local_148._0_8_ = *(ulong *)((long)local_188 + 0x48);
      if ((local_110 == 0.0) && (!NAN(local_110))) {
        FabArray<amrex::FArrayBox>::setVal<amrex::FArrayBox,_0>
                  (*(FabArray<amrex::FArrayBox> **)
                    &(this->m_a_coeffs).
                     super_vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                     .
                     super__Vector_base<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar42].
                     super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                     super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,0.0);
      }
      local_15c.do_tiling = false;
      local_15c.dynamic = true;
      local_15c.device_sync = true;
      local_15c.num_streams = Gpu::Device::max_gpu_streams;
      local_15c.tilesize.vect[0] = 0;
      local_15c.tilesize.vect[1] = 0;
      local_15c.tilesize.vect[2] = 0;
      local_188 = (Box *)((long)local_188 + 0xac);
      MFIter::MFIter(&mfi,*(FabArrayBase **)
                           &(this->m_a_coeffs).
                            super_vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                            .
                            super__Vector_base<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar42].
                            super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                            super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,
                     &local_15c);
      local_f8 = local_118 * local_138 * local_138;
      local_100 = local_118 * local_128 * local_128;
      dVar6 = local_148._0_8_;
      local_108 = local_118 * dVar6 * dVar6;
      uVar47 = local_148._4_4_;
      dStack_120 = local_128;
      dStack_130 = local_138;
      local_148._8_4_ = local_148._0_4_;
      local_148._0_8_ = dVar6;
      local_148._12_4_ = uVar47;
      uVar39 = uVar42;
      local_e0 = uVar42;
      while (mfi.currentIndex < mfi.endIndex) {
        MFIter::validbox(&local_178,&mfi);
        FabArray<amrex::FArrayBox>::array<amrex::FArrayBox,_0>
                  (&local_290,
                   *(FabArray<amrex::FArrayBox> **)
                    &(this->m_a_coeffs).
                     super_vector<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                     .
                     super__Vector_base<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,_std::allocator<amrex::Vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar42].
                     super_vector<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>.
                     super__Vector_base<amrex::MultiFab,_std::allocator<amrex::MultiFab>_>,&mfi);
        lVar43 = 0;
        while (lVar43 != 3) {
          FabArray<amrex::FArrayBox>::const_array<amrex::FArrayBox,_0>
                    (&local_2d0,
                     (FabArray<amrex::FArrayBox> *)
                     (lVar43 * 0x180 +
                     *(long *)&(this->m_b_coeffs).
                               super_vector<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                               .
                               super__Vector_base<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>,_std::allocator<amrex::Vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[uVar42].
                               super_vector<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                               .
                               super__Vector_base<std::array<amrex::MultiFab,_3UL>,_std::allocator<std::array<amrex::MultiFab,_3UL>_>_>
                     ),&mfi);
          low.vect[2] = local_178.smallend.vect[2];
          low.vect[0] = local_178.smallend.vect[0];
          low.vect[1] = local_178.smallend.vect[1];
          hi.vect[2] = local_178.bigend.vect[2];
          hi.vect[0] = local_178.bigend.vect[0];
          hi.vect[1] = local_178.bigend.vect[1];
          iVar12 = low.vect[lVar43] + -1;
          low.vect[lVar43] = iVar12;
          hi.vect[lVar43] = iVar12;
          local_1a8.btype.itype = local_178.btype.itype & ~(1 << ((uint)lVar43 & 0x1f));
          local_1a8.smallend.vect[0] = low.vect[0];
          local_1a8.smallend.vect[1] = low.vect[1];
          local_1a8.smallend.vect[2] = low.vect[2];
          local_1a8.bigend.vect[0] = hi.vect[0];
          local_1a8.bigend.vect[1] = hi.vect[1];
          local_1a8.bigend.vect[2] = hi.vect[2];
          hi.vect[2] = local_178.smallend.vect[2];
          hi.vect[0] = local_178.smallend.vect[0];
          hi.vect[1] = local_178.smallend.vect[1];
          hi_1.vect[2] = local_178.bigend.vect[2];
          hi_1.vect[0] = local_178.bigend.vect[0];
          hi_1.vect[1] = local_178.bigend.vect[1];
          IVar49 = Box::type(&local_178);
          local_a0[0] = IVar49.vect[0];
          local_a0[1] = IVar49.vect[1];
          local_a0[2] = IVar49.vect[2];
          iVar12 = (~local_a0[lVar43] & 1U) + hi_1.vect[lVar43];
          hi.vect[lVar43] = iVar12;
          hi_1.vect[lVar43] = iVar12;
          this_00 = local_188;
          iVar12 = hi_1.vect[2];
          uVar8 = hi_1.vect._0_8_;
          low.vect[0] = hi.vect[0];
          low.vect[1] = hi.vect[1];
          low.vect[2] = hi.vect[2];
          local_250 = lVar43;
          bVar9 = Box::contains(local_188,&local_1a8);
          bVar10 = Box::contains(this_00,(Box *)&low);
          if (!bVar9 || !bVar10) {
            local_c0 = (local_180->super_MLCellABecLap).super_MLCellLinOp.m_robin_bcval.
                       super_vector<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                       .
                       super__Vector_base<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>,_std::allocator<std::unique_ptr<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            local_d8 = ((local_180->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_lobc_orig
                        .
                        super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                        .
                        super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_elems + local_250;
            lVar35 = (long)local_1a8.smallend.vect[0];
            lVar32 = (long)local_1a8.smallend.vect[1];
            lVar36 = (long)local_1a8.smallend.vect[2];
            lVar23 = (long)local_1a8.bigend.vect[0];
            lVar27 = (long)local_1a8.bigend.vect[1];
            lVar28 = (long)local_1a8.bigend.vect[2];
            local_d0 = ((local_180->super_MLCellABecLap).super_MLCellLinOp.super_MLLinOp.m_hibc_orig
                        .
                        super_vector<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                        .
                        super__Vector_base<std::array<amrex::LinOpBCType,_3UL>,_std::allocator<std::array<amrex::LinOpBCType,_3UL>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_elems + local_250;
            lVar29 = (long)low.vect[0];
            lVar13 = (long)low.vect[1];
            lVar19 = (long)low.vect[2];
            local_23c = (int)uVar8;
            lVar44 = (long)local_23c;
            local_e8 = (long)mfi.currentIndex * 4;
            iStack_238 = SUB84(uVar8,4);
            lVar30 = (long)iStack_238;
            lVar31 = (long)iVar12;
            lVar43 = lVar35 * 8;
            local_a8 = lVar32 + 1;
            lVar1 = lVar32 * 8;
            lVar2 = lVar36 * 8;
            local_f0 = lVar36 + 1;
            lVar3 = lVar29 * 8;
            lVar4 = lVar13 * 8;
            lVar5 = lVar19 * 8;
            local_348 = 0;
            local_350 = 8;
            local_338 = 0;
            local_c8 = mfi.local_index_map;
            for (uVar45 = 0; uVar45 != local_b8; uVar45 = uVar45 + 1) {
              piVar20 = &mfi.currentIndex;
              if (mfi.local_index_map != (Vector<int,_std::allocator<int>_> *)0x0) {
                piVar20 = ((mfi.local_index_map)->super_vector<int,_std::allocator<int>_>).
                          super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start + mfi.currentIndex;
              }
              lVar16 = *(long *)(*(long *)((long)local_c0[uVar39]._M_t.
                                                 super___uniq_ptr_impl<amrex::MultiFab,_std::default_delete<amrex::MultiFab>_>
                                          + 0x108) + (long)*piVar20 * 8);
              lVar26 = *(long *)(lVar16 + 0x10);
              lVar37 = (long)*(int *)(lVar16 + 0x18);
              lVar38 = (long)*(int *)(lVar16 + 0x1c);
              lVar33 = (long)*(int *)(lVar16 + 0x20);
              lVar14 = (long)((*(int *)(lVar16 + 0x24) - *(int *)(lVar16 + 0x18)) + 1);
              lVar15 = (long)((*(int *)(lVar16 + 0x28) - *(int *)(lVar16 + 0x1c)) + 1);
              lVar16 = (long)((*(int *)(lVar16 + 0x2c) - *(int *)(lVar16 + 0x20)) + 1);
              local_b0 = uVar45 * 0xc;
              iVar12 = (int)local_250;
              if (local_d8[uVar45 * 3] == Robin && !bVar9) {
                if (iVar12 == 0) {
                  lVar18 = ((local_350 * lVar16 + lVar2 + lVar33 * -8) * lVar15 + lVar1 +
                           lVar38 * -8) * lVar14 + lVar37 * -8 + lVar26 + lVar43;
                  lVar46 = lVar15 * lVar14 * 8;
                  lVar25 = ((local_348 * lVar16 + lVar2 + lVar33 * -8) * lVar15 + lVar1 +
                           lVar38 * -8) * lVar14 + lVar37 * -8 + lVar26 + lVar43;
                  for (lVar21 = lVar36; lVar17 = lVar25, lVar22 = lVar32, lVar24 = lVar18,
                      lVar21 <= lVar28; lVar21 = lVar21 + 1) {
                    for (; lVar22 <= lVar27; lVar22 = lVar22 + 1) {
                      lVar34 = ((lVar22 - local_290.begin.y) * local_290.jstride +
                               (lVar21 - local_290.begin.z) * local_290.kstride + lVar35) * 8 +
                               local_290.nstride * local_338 + (long)local_290.begin.x * -8 + 8;
                      for (lVar41 = 0; lVar35 + lVar41 <= lVar23; lVar41 = lVar41 + 1) {
                        dVar6 = *(double *)(lVar17 + lVar41 * 8);
                        dVar7 = *(double *)(lVar24 + lVar41 * 8);
                        *(double *)((long)local_290.p + lVar41 * 8 + lVar34) =
                             (1.0 - (dVar7 * local_128 + dVar6 * -0.5) /
                                    (dVar7 * dStack_120 + dVar6 * 0.5)) *
                             *(double *)
                              ((long)local_2d0.p +
                              lVar41 * 8 +
                              local_2d0.nstride * local_338 +
                              ((lVar22 - local_2d0.begin.y) * local_2d0.jstride +
                              (lVar21 - local_2d0.begin.z) * local_2d0.kstride + lVar35) * 8 +
                              (long)local_2d0.begin.x * -8 + 8) * local_100 +
                             *(double *)((long)local_290.p + lVar41 * 8 + lVar34);
                      }
                      lVar17 = lVar17 + lVar14 * 8;
                      lVar24 = lVar24 + lVar14 * 8;
                    }
                    lVar18 = lVar18 + lVar46;
                    lVar25 = lVar25 + lVar46;
                  }
                }
                else if (iVar12 == 1) {
                  lVar25 = ((local_350 * lVar16 + lVar2 + lVar33 * -8) * lVar15 + lVar1 +
                           lVar38 * -8) * lVar14 + lVar37 * -8 + lVar26 + lVar43;
                  lVar18 = lVar15 * lVar14 * 8;
                  lVar46 = ((local_348 * lVar16 + lVar2 + lVar33 * -8) * lVar15 + lVar1 +
                           lVar38 * -8) * lVar14 + lVar37 * -8 + lVar26 + lVar43;
                  for (lVar21 = lVar36; lVar17 = lVar32, lVar22 = lVar32 + 1, lVar24 = lVar25,
                      lVar34 = lVar46, lVar21 <= lVar28; lVar21 = lVar21 + 1) {
                    while (lVar17 <= lVar27) {
                      lVar17 = lVar17 + 1;
                      lVar41 = local_290.nstride * local_338 +
                               (lVar22 - local_290.begin.y) * local_290.jstride * 8 +
                               (lVar21 - local_290.begin.z) * local_290.kstride * 8 +
                               (long)local_290.begin.x * -8 + lVar43;
                      for (lVar40 = 0; lVar35 + lVar40 <= lVar23; lVar40 = lVar40 + 1) {
                        dVar6 = *(double *)(lVar34 + lVar40 * 8);
                        dVar7 = *(double *)(lVar24 + lVar40 * 8);
                        *(double *)((long)local_290.p + lVar40 * 8 + lVar41) =
                             (1.0 - (dVar7 * local_138 + dVar6 * -0.5) /
                                    (dVar7 * dStack_130 + dVar6 * 0.5)) *
                             *(double *)
                              ((long)local_2d0.p +
                              lVar40 * 8 +
                              local_2d0.nstride * local_338 +
                              (lVar22 - local_2d0.begin.y) * local_2d0.jstride * 8 +
                              (lVar21 - local_2d0.begin.z) * local_2d0.kstride * 8 +
                              (long)local_2d0.begin.x * -8 + lVar43) * local_f8 +
                             *(double *)((long)local_290.p + lVar40 * 8 + lVar41);
                      }
                      lVar22 = lVar22 + 1;
                      lVar24 = lVar24 + lVar14 * 8;
                      lVar34 = lVar34 + lVar14 * 8;
                    }
                    lVar25 = lVar25 + lVar18;
                    lVar46 = lVar46 + lVar18;
                  }
                }
                else {
                  lVar46 = ((local_350 * lVar16 + lVar2 + lVar33 * -8) * lVar15 + lVar1 +
                           lVar38 * -8) * lVar14 + lVar37 * -8 + lVar26 + lVar43;
                  lVar25 = lVar15 * lVar14 * 8;
                  lVar18 = ((local_348 * lVar16 + lVar2 + lVar33 * -8) * lVar15 + lVar1 +
                           lVar38 * -8) * lVar14 + lVar37 * -8 + lVar26 + lVar43;
                  lVar21 = lVar36;
                  local_370 = lVar36 + 1;
                  while (lVar21 <= lVar28) {
                    lVar21 = lVar21 + 1;
                    lVar22 = lVar18;
                    lVar24 = lVar46;
                    for (lVar17 = lVar32; lVar17 <= lVar27; lVar17 = lVar17 + 1) {
                      lVar34 = local_290.nstride * local_338 +
                               (lVar17 - local_290.begin.y) * local_290.jstride * 8 +
                               (local_370 - local_290.begin.z) * local_290.kstride * 8 +
                               (long)local_290.begin.x * -8 + lVar43;
                      for (lVar41 = 0; lVar35 + lVar41 <= lVar23; lVar41 = lVar41 + 1) {
                        dVar6 = *(double *)(lVar22 + lVar41 * 8);
                        dVar7 = *(double *)(lVar24 + lVar41 * 8);
                        *(double *)((long)local_290.p + lVar41 * 8 + lVar34) =
                             (1.0 - (dVar7 * (double)local_148._0_8_ + dVar6 * -0.5) /
                                    (dVar7 * (double)local_148._8_8_ + dVar6 * 0.5)) *
                             *(double *)
                              ((long)local_2d0.p +
                              lVar41 * 8 +
                              local_2d0.nstride * local_338 +
                              (lVar17 - local_2d0.begin.y) * local_2d0.jstride * 8 +
                              (local_370 - local_2d0.begin.z) * local_2d0.kstride * 8 +
                              (long)local_2d0.begin.x * -8 + lVar43) * local_108 +
                             *(double *)((long)local_290.p + lVar41 * 8 + lVar34);
                      }
                      lVar24 = lVar24 + lVar14 * 8;
                      lVar22 = lVar22 + lVar14 * 8;
                    }
                    local_370 = local_370 + 1;
                    lVar46 = lVar46 + lVar25;
                    lVar18 = lVar18 + lVar25;
                  }
                }
              }
              if (local_d0[uVar45 * 3] == Robin && !bVar10) {
                if (iVar12 == 0) {
                  lVar25 = ((local_350 * lVar16 + lVar5 + lVar33 * -8) * lVar15 + lVar4 +
                           lVar38 * -8) * lVar14 + lVar37 * -8 + lVar26 + lVar3;
                  lVar21 = lVar15 * lVar14 * 8;
                  local_390 = ((lVar16 * local_348 + lVar5 + lVar33 * -8) * lVar15 + lVar4 +
                              lVar38 * -8) * lVar14 + lVar37 * -8 + lVar26 + lVar3;
                  for (lVar16 = lVar19; lVar26 = lVar13, lVar15 = local_390, lVar33 = lVar25,
                      lVar16 <= lVar31; lVar16 = lVar16 + 1) {
                    for (; lVar26 <= lVar30; lVar26 = lVar26 + 1) {
                      lVar38 = (lVar26 - local_290.begin.y) * local_290.jstride;
                      lVar46 = (lVar16 - local_290.begin.z) * local_290.kstride;
                      for (lVar37 = 0; lVar29 + lVar37 <= lVar44; lVar37 = lVar37 + 1) {
                        dVar6 = *(double *)(lVar15 + lVar37 * 8);
                        dVar7 = *(double *)(lVar33 + lVar37 * 8);
                        lVar18 = (long)(((low.vect[0] + -1) - local_290.begin.x) + (int)lVar37);
                        local_290.p[lVar38 + lVar46 + local_290.nstride * uVar45 + lVar18] =
                             (1.0 - (dVar7 * local_128 + dVar6 * -0.5) /
                                    (dVar7 * dStack_120 + dVar6 * 0.5)) *
                             *(double *)
                              ((long)local_2d0.p +
                              lVar37 * 8 +
                              local_2d0.nstride * local_338 +
                              (lVar26 - local_2d0.begin.y) * local_2d0.jstride * 8 +
                              (lVar16 - local_2d0.begin.z) * local_2d0.kstride * 8 +
                              (long)local_2d0.begin.x * -8 + lVar3) * local_100 +
                             local_290.p[lVar38 + lVar46 + local_290.nstride * uVar45 + lVar18];
                      }
                      lVar15 = lVar15 + lVar14 * 8;
                      lVar33 = lVar33 + lVar14 * 8;
                    }
                    lVar25 = lVar25 + lVar21;
                    local_390 = local_390 + lVar21;
                  }
                }
                else if (iVar12 == 1) {
                  lVar25 = ((local_350 * lVar16 + lVar5 + lVar33 * -8) * lVar15 + lVar4 +
                           lVar38 * -8) * lVar14 + lVar37 * -8 + lVar26 + lVar3;
                  lVar21 = lVar15 * lVar14 * 8;
                  local_390 = ((lVar16 * local_348 + lVar5 + lVar33 * -8) * lVar15 + lVar4 +
                              lVar38 * -8) * lVar14 + lVar37 * -8 + lVar26 + lVar3;
                  for (lVar16 = lVar19; lVar26 = lVar25, lVar15 = local_390, lVar33 = lVar13,
                      iVar12 = low.vect[1] + -1, lVar16 <= lVar31; lVar16 = lVar16 + 1) {
                    for (; lVar33 <= lVar30; lVar33 = lVar33 + 1) {
                      lVar37 = local_290.nstride * local_338 +
                               (iVar12 - local_290.begin.y) * local_290.jstride * 8 +
                               (lVar16 - local_290.begin.z) * local_290.kstride * 8 +
                               (long)local_290.begin.x * -8 + lVar3;
                      for (lVar38 = 0; lVar29 + lVar38 <= lVar44; lVar38 = lVar38 + 1) {
                        dVar6 = *(double *)(lVar15 + lVar38 * 8);
                        dVar7 = *(double *)(lVar26 + lVar38 * 8);
                        *(double *)((long)local_290.p + lVar38 * 8 + lVar37) =
                             (1.0 - (dVar7 * local_138 + dVar6 * -0.5) /
                                    (dVar7 * dStack_130 + dVar6 * 0.5)) *
                             *(double *)
                              ((long)local_2d0.p +
                              lVar38 * 8 +
                              local_2d0.nstride * local_338 +
                              (lVar33 - local_2d0.begin.y) * local_2d0.jstride * 8 +
                              (lVar16 - local_2d0.begin.z) * local_2d0.kstride * 8 +
                              (long)local_2d0.begin.x * -8 + lVar3) * local_f8 +
                             *(double *)((long)local_290.p + lVar38 * 8 + lVar37);
                      }
                      lVar26 = lVar26 + lVar14 * 8;
                      lVar15 = lVar15 + lVar14 * 8;
                      iVar12 = iVar12 + 1;
                    }
                    lVar25 = lVar25 + lVar21;
                    local_390 = local_390 + lVar21;
                  }
                }
                else {
                  lVar25 = ((local_350 * lVar16 + lVar5 + lVar33 * -8) * lVar15 + lVar4 +
                           lVar38 * -8) * lVar14 + lVar37 * -8 + lVar26 + lVar3;
                  lVar21 = lVar15 * lVar14 * 8;
                  local_390 = ((lVar16 * local_348 + lVar5 + lVar33 * -8) * lVar15 + lVar4 +
                              lVar38 * -8) * lVar14 + lVar37 * -8 + lVar26 + lVar3;
                  iVar12 = low.vect[2] + -1;
                  for (lVar16 = lVar19; lVar26 = local_390, lVar15 = lVar13, lVar33 = lVar25,
                      lVar16 <= lVar31; lVar16 = lVar16 + 1) {
                    for (; lVar15 <= lVar30; lVar15 = lVar15 + 1) {
                      lVar37 = local_290.nstride * local_338 +
                               (iVar12 - local_290.begin.z) * local_290.kstride * 8 +
                               (lVar15 - local_290.begin.y) * local_290.jstride * 8 +
                               (long)local_290.begin.x * -8 + lVar3;
                      for (lVar38 = 0; lVar29 + lVar38 <= lVar44; lVar38 = lVar38 + 1) {
                        dVar6 = *(double *)(lVar26 + lVar38 * 8);
                        dVar7 = *(double *)(lVar33 + lVar38 * 8);
                        *(double *)((long)local_290.p + lVar38 * 8 + lVar37) =
                             (1.0 - (dVar7 * (double)local_148._0_8_ + dVar6 * -0.5) /
                                    (dVar7 * (double)local_148._8_8_ + dVar6 * 0.5)) *
                             *(double *)
                              ((long)local_2d0.p +
                              lVar38 * 8 +
                              local_2d0.nstride * local_338 +
                              (lVar15 - local_2d0.begin.y) * local_2d0.jstride * 8 +
                              (lVar16 - local_2d0.begin.z) * local_2d0.kstride * 8 +
                              (long)local_2d0.begin.x * -8 + lVar3) * local_108 +
                             *(double *)((long)local_290.p + lVar38 * 8 + lVar37);
                      }
                      lVar26 = lVar26 + lVar14 * 8;
                      lVar33 = lVar33 + lVar14 * 8;
                    }
                    iVar12 = iVar12 + 1;
                    lVar25 = lVar25 + lVar21;
                    local_390 = local_390 + lVar21;
                  }
                }
              }
              local_338 = local_338 + 8;
              local_350 = local_350 + 0x18;
              local_348 = local_348 + 0x18;
              uVar39 = local_e0;
            }
          }
          this = local_180;
          lVar43 = local_250 + 1;
        }
        MFIter::operator++(&mfi);
      }
      MFIter::~MFIter(&mfi);
      uVar42 = uVar39 + 1;
    }
  }
  return;
}

Assistant:

void
MLABecLaplacian::applyRobinBCTermsCoeffs ()
{
    if (!hasRobinBC()) return;

    const int ncomp = getNComp();
    bool reset_alpha = false;
    if (m_a_scalar == Real(0.0)) {
        m_a_scalar = Real(1.0);
        reset_alpha = true;
    }
    const Real bovera = m_b_scalar/m_a_scalar;

    for (int amrlev = 0; amrlev < m_num_amr_levels; ++amrlev) {
        const int mglev = 0;
        const Box& domain = m_geom[amrlev][mglev].Domain();
        const Real dxi = m_geom[amrlev][mglev].InvCellSize(0);
        const Real dyi = (AMREX_SPACEDIM >= 2) ? m_geom[amrlev][mglev].InvCellSize(1) : Real(1.0);
        const Real dzi = (AMREX_SPACEDIM == 3) ? m_geom[amrlev][mglev].InvCellSize(2) : Real(1.0);

        if (reset_alpha) {
            m_a_coeffs[amrlev][mglev].setVal(0.0);
        }

        MFItInfo mfi_info;
        if (Gpu::notInLaunchRegion()) mfi_info.SetDynamic(true);

#ifdef AMREX_USE_OMP
#pragma omp parallel if (Gpu::notInLaunchRegion())
#endif
        for (MFIter mfi(m_a_coeffs[amrlev][mglev], mfi_info); mfi.isValid(); ++mfi)
        {
            const Box& vbx = mfi.validbox();
            Array4<Real> const& afab = m_a_coeffs[amrlev][mglev].array(mfi);
            for (int idim = 0; idim < AMREX_SPACEDIM; ++idim) {
                Array4<Real const> const& bfab = m_b_coeffs[amrlev][mglev][idim].const_array(mfi);
                const Box& blo = amrex::adjCellLo(vbx,idim);
                const Box& bhi = amrex::adjCellHi(vbx,idim);
                bool outside_domain_lo = !(domain.contains(blo));
                bool outside_domain_hi = !(domain.contains(bhi));
                if ((!outside_domain_lo) && (!outside_domain_hi)) continue;
                for (int icomp = 0; icomp < ncomp; ++icomp) {
                    Array4<Real const> const& rbc = (*m_robin_bcval[amrlev])[mfi].const_array(icomp*3);
                    if (m_lobc_orig[icomp][idim] == LinOpBCType::Robin && outside_domain_lo)
                    {
                        if (idim == 0) {
                            Real fac = bovera*dxi*dxi;
                            AMREX_HOST_DEVICE_FOR_3D(blo, i, j, k,
                            {
                                Real B = (rbc(i,j,k,1)*dxi - rbc(i,j,k,0)*Real(0.5))
                                    /    (rbc(i,j,k,1)*dxi + rbc(i,j,k,0)*Real(0.5));
                                afab(i+1,j,k,icomp) += fac*bfab(i+1,j,k,icomp)*(Real(1.0)-B);
                            });
                        } else if (idim == 1) {
                            Real fac = bovera*dyi*dyi;
                            AMREX_HOST_DEVICE_FOR_3D(blo, i, j, k,
                            {
                                Real B = (rbc(i,j,k,1)*dyi - rbc(i,j,k,0)*Real(0.5))
                                    /    (rbc(i,j,k,1)*dyi + rbc(i,j,k,0)*Real(0.5));
                                afab(i,j+1,k,icomp) += fac*bfab(i,j+1,k,icomp)*(Real(1.0)-B);
                            });
                        } else {
                            Real fac = bovera*dzi*dzi;
                            AMREX_HOST_DEVICE_FOR_3D(blo, i, j, k,
                            {
                                Real B = (rbc(i,j,k,1)*dzi - rbc(i,j,k,0)*Real(0.5))
                                    /    (rbc(i,j,k,1)*dzi + rbc(i,j,k,0)*Real(0.5));
                                afab(i,j,k+1,icomp) += fac*bfab(i,j,k+1,icomp)*(Real(1.0)-B);
                            });
                        }
                    }
                    if (m_hibc_orig[icomp][idim] == LinOpBCType::Robin && outside_domain_hi)
                    {
                        if (idim == 0) {
                            Real fac = bovera*dxi*dxi;
                            AMREX_HOST_DEVICE_FOR_3D(bhi, i, j, k,
                            {
                                Real B = (rbc(i,j,k,1)*dxi - rbc(i,j,k,0)*Real(0.5))
                                    /    (rbc(i,j,k,1)*dxi + rbc(i,j,k,0)*Real(0.5));
                                afab(i-1,j,k,icomp) += fac*bfab(i,j,k,icomp)*(Real(1.0)-B);
                            });
                        } else if (idim == 1) {
                            Real fac = bovera*dyi*dyi;
                            AMREX_HOST_DEVICE_FOR_3D(bhi, i, j, k,
                            {
                                Real B = (rbc(i,j,k,1)*dyi - rbc(i,j,k,0)*Real(0.5))
                                    /    (rbc(i,j,k,1)*dyi + rbc(i,j,k,0)*Real(0.5));
                                afab(i,j-1,k,icomp) += fac*bfab(i,j,k,icomp)*(Real(1.0)-B);
                            });
                        } else {
                            Real fac = bovera*dzi*dzi;
                            AMREX_HOST_DEVICE_FOR_3D(bhi, i, j, k,
                            {
                                Real B = (rbc(i,j,k,1)*dzi - rbc(i,j,k,0)*Real(0.5))
                                    /    (rbc(i,j,k,1)*dzi + rbc(i,j,k,0)*Real(0.5));
                                afab(i,j,k-1,icomp) += fac*bfab(i,j,k,icomp)*(Real(1.0)-B);
                            });
                        }
                    }
                }
            }
        }
    }
}